

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
container_ixor(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  uint8_t uVar2;
  int iVar3;
  array_container_t *src_1;
  array_container_t *src_2;
  container_t *result;
  container_t *local_38;
  byte local_2a;
  byte local_29;
  
  local_2a = type2;
  local_29 = type1;
  src_1 = (array_container_t *)get_writable_copy_if_shared(c1,&local_29);
  src_2 = (array_container_t *)container_unwrap_shared(c2,&local_2a);
  local_38 = (container_t *)0x0;
  switch((uint)local_2a + (uint)local_29 * 4) {
  case 5:
    _Var1 = bitset_bitset_container_ixor
                      ((bitset_container_t *)src_1,(bitset_container_t *)src_2,&local_38);
    break;
  case 6:
    _Var1 = bitset_array_container_ixor((bitset_container_t *)src_1,src_2,&local_38);
    break;
  case 7:
    _Var1 = bitset_run_container_ixor
                      ((bitset_container_t *)src_1,(run_container_t *)src_2,&local_38);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x16e4,
                  "container_t *container_ixor(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    _Var1 = array_bitset_container_ixor(src_1,(bitset_container_t *)src_2,&local_38);
    break;
  case 10:
    _Var1 = array_array_container_ixor(src_1,src_2,&local_38);
    break;
  case 0xb:
    iVar3 = array_run_container_ixor(src_1,(run_container_t *)src_2,&local_38);
    uVar2 = (uint8_t)iVar3;
    goto LAB_0010913a;
  case 0xd:
    _Var1 = run_bitset_container_ixor
                      ((run_container_t *)src_1,(bitset_container_t *)src_2,&local_38);
    break;
  case 0xe:
    iVar3 = run_array_container_ixor((run_container_t *)src_1,src_2,&local_38);
    uVar2 = (uint8_t)iVar3;
    goto LAB_0010913a;
  case 0xf:
    iVar3 = run_run_container_ixor((run_container_t *)src_1,(run_container_t *)src_2,&local_38);
    uVar2 = (uint8_t)iVar3;
    goto LAB_0010913a;
  }
  uVar2 = '\x02' - _Var1;
LAB_0010913a:
  *result_type = uVar2;
  return local_38;
}

Assistant:

static inline container_t *container_ixor(
    container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = get_writable_copy_if_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_ixor(
                                CAST_bitset(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_ixor(
                                CAST_array(c1), const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            *result_type = run_run_container_ixor(
                CAST_run(c1), const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            *result_type = bitset_array_container_ixor(
                                CAST_bitset(c1), const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            *result_type = array_bitset_container_ixor(
                                CAST_array(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            *result_type =
                bitset_run_container_ixor(
                    CAST_bitset(c1), const_CAST_run(c2), &result)
                        ? BITSET_CONTAINER_TYPE
                        : ARRAY_CONTAINER_TYPE;

            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_ixor(
                                CAST_run(c1), const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            *result_type = array_run_container_ixor(
                                CAST_array(c1), const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            *result_type = run_array_container_ixor(
                                CAST_run(c1), const_CAST_array(c2), &result);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}